

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O0

void __thiscall IPAsirMiniSAT::ana(IPAsirMiniSAT *this)

{
  int iVar1;
  void *pvVar2;
  Lit *pLVar3;
  long in_RDI;
  ulong uVar4;
  int tmp;
  int i;
  int local_c;
  
  iVar1 = Minisat::Solver::nVars((Solver *)0x161f58);
  *(int *)(in_RDI + 0x1540) = iVar1;
  uVar4 = (ulong)iVar1;
  if ((long)uVar4 < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar2 = operator_new__(uVar4);
  *(void **)(in_RDI + 0x1548) = pvVar2;
  memset(*(void **)(in_RDI + 0x1548),0,(long)*(int *)(in_RDI + 0x1540));
  local_c = 0;
  while( true ) {
    iVar1 = Minisat::vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x18));
    if (iVar1 <= local_c) break;
    pLVar3 = Minisat::vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x18),local_c);
    iVar1 = Minisat::var((Lit)pLVar3->x);
    *(undefined1 *)(*(long *)(in_RDI + 0x1548) + (long)iVar1) = 1;
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void ana()
    {
        fmap = new unsigned char[szfmap = nVars()];
        memset(fmap, 0, szfmap);
        for (int i = 0; i < conflict.size(); i++) {
            int tmp = var(conflict[i]);
            assert(0 <= tmp && tmp < szfmap);
            fmap[tmp] = 1;
        }
    }